

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

bool __thiscall Analyser::analyse_function_definition(Analyser *this)

{
  int iVar1;
  char type;
  string *this_00;
  bool bVar2;
  any aStack_c8;
  optional<Token> next;
  string func;
  string local_68;
  string local_48 [32];
  
  nextToken(&next,this);
  bVar2 = (bool)(next.super__Optional_base<Token,_false,_false>._M_payload.
                 super__Optional_payload<Token,_true,_false,_false>.
                 super__Optional_payload_base<Token>._M_payload._M_value._type == RESERVED_WORD &
                next.super__Optional_base<Token,_false,_false>._M_payload.
                super__Optional_payload<Token,_true,_false,_false>.
                super__Optional_payload_base<Token>._M_engaged);
  unreadToken(this);
  if (bVar2 == true) {
    type = analyse_type_specifier(this);
    nextToken((optional<Token> *)&func,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)&next,(_Optional_payload_base<Token> *)&func);
    std::_Optional_payload_base<Token>::_M_reset((_Optional_payload_base<Token> *)&func);
    if ((next.super__Optional_base<Token,_false,_false>._M_payload.
         super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
         _M_engaged != true) ||
       (next.super__Optional_base<Token,_false,_false>._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type != IDENTIFIER)) {
      this_00 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                (local_48,"Missing identifier",(allocator<char> *)&func);
      iVar1 = this->_currentLine;
      std::__cxx11::string::string(this_00,local_48);
      *(long *)(this_00 + 0x20) = (long)iVar1;
      __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
    }
    std::any::any(&aStack_c8,
                  &next.super__Optional_base<Token,_false,_false>._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value);
    std::any_cast<std::__cxx11::string>(&func,&aStack_c8);
    std::any::reset(&aStack_c8);
    std::__cxx11::string::string((string *)&local_68,(string *)&func);
    addFunction(this,&local_68,type);
    std::__cxx11::string::~string((string *)&local_68);
    if (next.super__Optional_base<Token,_false,_false>._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    addConstant(this,(Token *)&next);
    analyse_parameter_clause(this);
    analyse_compound_statement(this);
    addRet(this);
    std::__cxx11::string::~string((string *)&func);
  }
  std::_Optional_payload_base<Token>::_M_reset((_Optional_payload_base<Token> *)&next);
  return bVar2;
}

Assistant:

bool Analyser::analyse_function_definition() {
	auto next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::RESERVED_WORD) {
		unreadToken();
		return false;
	}
	unreadToken();
	char type = analyse_type_specifier();
	//<identifier>
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::IDENTIFIER) {
		throw Error("Missing identifier", _currentLine);
	}
	std::string func = std::any_cast<std::string>(next.value().GetValue());
	addFunction(func, type);
	addConstant(next.value());
	//<parameter - clause>
	analyse_parameter_clause();
	analyse_compound_statement();
	addRet();
	return true;
}